

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

string * __thiscall
FastPForLib::Simple16<false>::name_abi_cxx11_(string *__return_storage_ptr__,Simple16<false> *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Simple16","");
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return "Simple16"; }